

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[2],char_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1)

{
  char cVar1;
  size_t __n;
  String *result;
  char *__dest;
  
  __n = strlen((char *)this);
  cVar1 = (*params)[0];
  heapString(__return_storage_ptr__,__n + 1);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  if (__n != 0) {
    memcpy(__dest,this,__n);
    __dest = __dest + __n;
  }
  *__dest = cVar1;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}